

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O3

uint32 get_import_func_count(module *m)

{
  uint32 uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(m->import_sec).import_segment_count;
  if (uVar2 != 0) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + ((&(((m->import_sec).import_segment_addr)->im_desc).tag)[lVar3] == '\0');
      lVar3 = lVar3 + 0x30;
    } while (uVar2 * 0x30 != lVar3);
    return uVar1;
  }
  return 0;
}

Assistant:

uint32 get_import_func_count(module *m) {
    uint32 count = 0;
    for (uint32 i = 0; i < m->import_sec.import_segment_count; i++) {
        if ((m->import_sec.import_segment_addr + i)->im_desc.tag == func_im_export_tag)
            count++;
    }
    return count;
}